

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O1

int add_attribute_string(stack_st_X509_ATTRIBUTE *attrs,int nid,char *buffer)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint len;
  char *pcVar4;
  ASN1_STRING *pAVar5;
  size_t sVar6;
  X509_ATTRIBUTE *pXVar7;
  ASN1_STRING *str;
  BIO_METHOD *pBVar8;
  BIO *pBVar9;
  PKCS7 *pPVar10;
  char **b;
  stack_st_PKCS7_SIGNER_INFO *psVar11;
  FILE *pFVar12;
  FILE *pFVar13;
  X509_STORE *ctx;
  X509_STORE_CTX *ctx_00;
  FILE *pFVar14;
  FILE *b_00;
  X509 **ppXVar15;
  ulong uVar16;
  void *__src;
  char *pcVar17;
  ASN1_OBJECT *a;
  ASN1_TYPE *pAVar18;
  FILE *pFVar19;
  X509_NAME *pXVar20;
  X509_NAME *b_01;
  X509 *a_00;
  X509_EXTENSION *pXVar21;
  ulong uVar22;
  int in_ECX;
  char **ppcVar23;
  EVP_PKEY **buffer_00;
  ulong uVar24;
  uint extraout_EDX;
  char *data;
  FILE *extraout_RDX;
  undefined8 uVar25;
  int n;
  FILE *pFVar26;
  ASN1_STRING *pAVar27;
  char *pcVar28;
  int *piVar29;
  int *cert;
  long lVar30;
  char **ppcVar31;
  uint uStack_265c;
  PKCS7 *pPStack_2658;
  BIO *pBStack_2650;
  long lStack_2648;
  byte abStack_2640 [64];
  char acStack_2600 [1024];
  char acStack_2200 [1032];
  FILE *pFStack_1df8;
  int *piStack_1df0;
  FILE *pFStack_1de8;
  FILE *pFStack_1de0;
  FILE *pFStack_1dd8;
  FILE *pFStack_1dd0;
  FILE *pFStack_1dc0;
  FILE aFStack_1db8 [4];
  FILE *pFStack_19b0;
  int *piStack_19a8;
  FILE *pFStack_19a0;
  FILE *pFStack_1998;
  FILE *pFStack_1990;
  FILE *pFStack_1988;
  FILE aFStack_1980 [4];
  FILE aFStack_1580 [4];
  char acStack_1180 [2056];
  FILE *pFStack_978;
  FILE *pFStack_970;
  FILE *pFStack_968;
  FILE *pFStack_960;
  FILE *pFStack_958;
  FILE *pFStack_950;
  FILE *pFStack_940;
  FILE *pFStack_938;
  FILE *pFStack_930;
  FILE *pFStack_928;
  FILE *pFStack_920;
  FILE *pFStack_918;
  code *pcStack_910;
  FILE *pFStack_900;
  FILE *pFStack_8f8;
  FILE *pFStack_8f0;
  FILE *pFStack_8e8;
  FILE *pFStack_8e0;
  FILE *pFStack_8d8;
  undefined1 auStack_8c8 [1040];
  ASN1_STRING *pAStack_4b8;
  FILE *pFStack_4b0;
  X509_STORE *pXStack_4a8;
  X509_STORE_CTX *pXStack_4a0;
  FILE *pFStack_498;
  FILE *pFStack_490;
  undefined1 auStack_488 [1032];
  ASN1_STRING *pAStack_80;
  ASN1_STRING *pAStack_78;
  
  pcVar28 = pname;
  if (d_flag != 0) {
    pcVar4 = OBJ_nid2sn(nid);
    printf("%s: adding string attribute %s\n",pcVar28,pcVar4);
  }
  pAVar5 = ASN1_STRING_new();
  sVar6 = strlen(buffer);
  pAVar27 = pAVar5;
  iVar2 = ASN1_STRING_set(pAVar5,buffer,(int)sVar6);
  n = (int)buffer;
  if (0 < iVar2) {
    pXVar7 = X509_ATTRIBUTE_create(nid,0x13,pAVar5);
    OPENSSL_sk_push(attrs,pXVar7);
    return 0;
  }
  add_attribute_string_cold_1();
  pcVar28 = pname;
  if (d_flag != 0) {
    pcVar4 = OBJ_nid2sn(n);
    printf("%s: adding octet attribute %s\n",pcVar28,pcVar4);
  }
  str = ASN1_STRING_new();
  pcVar28 = data;
  pAVar5 = str;
  iVar2 = ASN1_STRING_set(str,data,in_ECX);
  if (0 < iVar2) {
    pXVar7 = X509_ATTRIBUTE_create(n,4,str);
    OPENSSL_sk_push(pAVar27,pXVar7);
    return 0;
  }
  add_attribute_octet_cold_1();
  pFStack_490 = (FILE *)0x10cca2;
  pAStack_80 = pAVar27;
  pAStack_78 = str;
  pBVar8 = BIO_s_mem();
  pFStack_490 = (FILE *)0x10ccaa;
  pBVar9 = BIO_new(pBVar8);
  if (v_flag != 0) {
    pFStack_490 = (FILE *)0x10ccd1;
    printf("%s: reading outer PKCS#7\n",pname);
  }
  pFStack_490 = (FILE *)0x10cce6;
  uVar3 = BIO_write(pBVar9,*(void **)(pAVar5 + 8),*(int *)&pAVar5[8].data);
  if ((int)uVar3 < 1) {
    pFStack_490 = (FILE *)0x10d070;
    pkcs7_verify_unwrap_cold_12();
LAB_0010d070:
    pFStack_490 = (FILE *)0x10d075;
    pkcs7_verify_unwrap_cold_11();
LAB_0010d075:
    pFStack_490 = (FILE *)0x10d07a;
    pkcs7_verify_unwrap_cold_1();
LAB_0010d07a:
    pFStack_490 = (FILE *)0x10d07f;
    pkcs7_verify_unwrap_cold_10();
  }
  else {
    if (v_flag != 0) {
      pFStack_490 = (FILE *)0x10cd14;
      printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar3);
    }
    pFStack_490 = (FILE *)0x10cd21;
    BIO_set_flags(pBVar9,0x200);
    pFStack_490 = (FILE *)0x10cd2b;
    pPVar10 = d2i_PKCS7_bio(pBVar9,(PKCS7 **)0x0);
    pAVar5[7].flags = (long)pPVar10;
    if (pPVar10 == (PKCS7 *)0x0) goto LAB_0010d070;
    if (d_flag != 0) {
      pFStack_490 = (FILE *)0x10cd5f;
      printf("%s: printing PEM fomatted PKCS#7\n",pname);
      pFStack_490 = (FILE *)0x10cd75;
      PEM_write_PKCS7(_stdout,(PKCS7 *)pAVar5[7].flags);
    }
    pFStack_490 = (FILE *)0x10cd85;
    iVar2 = OBJ_obj2nid(*(ASN1_OBJECT **)(pAVar5[7].flags + 0x18));
    if (iVar2 != 0x16) goto LAB_0010d075;
    pFStack_490 = (FILE *)0x10cd9c;
    pBVar9 = PKCS7_dataInit((PKCS7 *)pAVar5[7].flags,(BIO *)0x0);
    if (pBVar9 == (BIO *)0x0) goto LAB_0010d07a;
    pFStack_490 = (FILE *)0x10cdad;
    pBVar8 = BIO_s_mem();
    pFStack_490 = (FILE *)0x10cdb5;
    b = (char **)BIO_new(pBVar8);
    pFStack_490 = (FILE *)0x10cdc8;
    uVar3 = BIO_read(pBVar9,auStack_488,0x400);
    len = uVar3;
    while (0 < (int)len) {
      pFStack_490 = (FILE *)0x10cde0;
      BIO_write((BIO *)b,auStack_488,len);
      pFStack_490 = (FILE *)0x10cdf0;
      len = BIO_read(pBVar9,auStack_488,0x400);
      uVar3 = uVar3 + len;
    }
    pFStack_490 = (FILE *)0x10ce07;
    BIO_ctrl((BIO *)b,0xb,0,(void *)0x0);
    if (v_flag != 0) {
      pFStack_490 = (FILE *)0x10ce2d;
      printf("%s: PKCS#7 contains %d bytes of signed data\n",pname,(ulong)uVar3);
    }
    pFStack_490 = (FILE *)0x10ce39;
    psVar11 = PKCS7_get_signer_info((PKCS7 *)pAVar5[7].flags);
    if (psVar11 != (stack_st_PKCS7_SIGNER_INFO *)0x0) {
      if (v_flag != 0) {
        pFStack_490 = (FILE *)0x10ce69;
        printf("%s: verifying signature\n",pname);
      }
      pFStack_490 = (FILE *)0x10ce73;
      pFVar12 = (FILE *)OPENSSL_sk_value(psVar11,0);
      pFStack_490 = (FILE *)0x10ce85;
      pFVar13 = (FILE *)PKCS7_cert_from_signer_info
                                  ((PKCS7 *)pAVar5[7].flags,(PKCS7_SIGNER_INFO *)pFVar12);
      if (pFVar13 == (FILE *)0x0) {
        pFStack_490 = (FILE *)0x10cea5;
        printf("%s: Can\'t read signer cert from pkcs7\n",pname);
      }
      pFStack_490 = (FILE *)0x10ceba;
      iVar2 = PKCS7_signatureVerify
                        (pBVar9,(PKCS7 *)pAVar5[7].flags,(PKCS7_SIGNER_INFO *)pFVar12,
                         (X509 *)pFVar13);
      if (iVar2 < 1) goto LAB_0010d084;
      if (v_flag != 0) {
        pFStack_490 = (FILE *)0x10cee6;
        printf("%s: signature ok\n");
      }
      pFStack_490 = (FILE *)0x10ceeb;
      ctx = X509_STORE_new();
      if (ctx == (X509_STORE *)0x0) {
        pFStack_490 = (FILE *)0x10d048;
        pkcs7_verify_unwrap_cold_2();
      }
      pFStack_490 = (FILE *)0x10cf01;
      X509_STORE_set_flags(ctx,0);
      pFStack_490 = (FILE *)0x10cf0e;
      X509_STORE_load_locations(ctx,pcVar28,(char *)0x0);
      pFStack_490 = (FILE *)0x10cf13;
      ctx_00 = X509_STORE_CTX_new();
      if (ctx_00 == (X509_STORE_CTX *)0x0) {
        pFStack_490 = (FILE *)0x10d052;
        pkcs7_verify_unwrap_cold_3();
      }
      buffer_00 = (EVP_PKEY **)0x0;
      pFStack_490 = (FILE *)0x10cf2f;
      iVar2 = X509_STORE_CTX_init(ctx_00,ctx,(X509 *)pFVar13,(stack_st_X509 *)0x0);
      if (iVar2 == 0) {
        pFStack_490 = (FILE *)0x10d05c;
        pkcs7_verify_unwrap_cold_4();
      }
      pFStack_490 = (FILE *)0x10cf3f;
      iVar2 = X509_verify_cert(ctx_00);
      if (iVar2 == 0) {
        pFStack_490 = (FILE *)0x10d066;
        pkcs7_verify_unwrap_cold_5();
      }
      pFVar14 = pFVar12;
      if (w_flag == 0) {
LAB_0010d005:
        pFStack_490 = (FILE *)0x10d00f;
        pFVar19 = (FILE *)b;
        pPVar10 = d2i_PKCS7_bio((BIO *)b,(PKCS7 **)0x0);
        pAVar5[7].flags = (long)pPVar10;
        if (pPVar10 != (PKCS7 *)0x0) {
          pFStack_490 = (FILE *)0x10d027;
          X509_STORE_free(ctx);
          pFStack_490 = (FILE *)0x10d02f;
          X509_STORE_CTX_cleanup(ctx_00);
          return 0;
        }
        pFStack_490 = (FILE *)0x10d0ba;
        pkcs7_verify_unwrap_cold_8();
        pFVar12 = pFVar14;
LAB_0010d0ba:
        pFVar14 = pFVar12;
        pFStack_490 = (FILE *)0x10d0bf;
        pkcs7_verify_unwrap_cold_7();
      }
      else {
        pFStack_490 = (FILE *)0x10cf6d;
        pFVar19 = (FILE *)w_char;
        pFVar14 = fopen(w_char,"w");
        if (pFVar14 == (FILE *)0x0) goto LAB_0010d0ba;
        if (v_flag != 0) {
          pFStack_490 = (FILE *)0x10cf9d;
          printf("%s: writing cert\n",w_char);
        }
        if (d_flag != 0) {
          pFStack_490 = (FILE *)0x10cfbb;
          PEM_write_X509(_stdout,(X509 *)pFVar13);
        }
        pFStack_490 = (FILE *)0x10cfc6;
        pFVar19 = pFVar14;
        iVar2 = PEM_write_X509(pFVar14,(X509 *)pFVar13);
        if (iVar2 == 1) {
          if (v_flag != 0) {
            pFStack_490 = (FILE *)0x10cffd;
            printf("%s: certificate written as %s\n",pname,w_char);
          }
          pFStack_490 = (FILE *)0x10d005;
          fclose(pFVar14);
          goto LAB_0010d005;
        }
      }
      pFStack_490 = (FILE *)pkcs7_unwrap;
      pkcs7_verify_unwrap_cold_6();
      pFStack_8d8 = (FILE *)0x10d0dd;
      pAStack_4b8 = pAVar5;
      pFStack_4b0 = pFVar13;
      pXStack_4a8 = ctx;
      pXStack_4a0 = ctx_00;
      pFStack_498 = (FILE *)b;
      pFStack_490 = pFVar14;
      pBVar8 = BIO_s_mem();
      pFStack_8d8 = (FILE *)0x10d0e5;
      pFVar12 = (FILE *)BIO_new(pBVar8);
      cert = &v_flag;
      if (v_flag != 0) {
        pFStack_8d8 = (FILE *)0x10d10e;
        printf("%s: reading outer PKCS#7\n",pname);
      }
      pFVar26 = *(FILE **)&pFVar19->_mode;
      pFStack_8d8 = (FILE *)0x10d123;
      pcVar28 = (char *)pFVar12;
      uVar3 = BIO_write((BIO *)pFVar12,pFVar26,*(int *)(pFVar19->_unused2 + 4));
      if ((int)uVar3 < 1) {
        pFStack_8d8 = (FILE *)0x10d77a;
        pkcs7_unwrap_cold_21();
LAB_0010d77a:
        pFStack_8d8 = (FILE *)0x10d77f;
        pkcs7_unwrap_cold_1();
LAB_0010d77f:
        pFStack_8d8 = (FILE *)0x10d784;
        pkcs7_unwrap_cold_20();
LAB_0010d784:
        pFStack_8d8 = (FILE *)0x10d789;
        pkcs7_unwrap_cold_19();
LAB_0010d789:
        pFStack_8d8 = (FILE *)0x10d78e;
        pkcs7_unwrap_cold_18();
LAB_0010d78e:
        pFStack_8d8 = (FILE *)0x10d793;
        pkcs7_unwrap_cold_17();
LAB_0010d793:
        pcVar4 = (char *)pFVar13;
        pFStack_8d8 = (FILE *)0x10d798;
        pkcs7_unwrap_cold_2();
LAB_0010d798:
        pFStack_8d8 = (FILE *)0x10d79d;
        pkcs7_unwrap_cold_3();
LAB_0010d79d:
        pFStack_8d8 = (FILE *)0x10d7a2;
        pkcs7_unwrap_cold_4();
LAB_0010d7a2:
        pFStack_8d8 = (FILE *)0x10d7a7;
        pkcs7_unwrap_cold_5();
LAB_0010d7a7:
        pFStack_8d8 = (FILE *)0x10d7ac;
        pkcs7_unwrap_cold_7();
LAB_0010d7ac:
        pFStack_8d8 = (FILE *)0x10d7b1;
        pkcs7_unwrap_cold_9();
LAB_0010d7b1:
        pFStack_8d8 = (FILE *)0x10d7b6;
        pkcs7_unwrap_cold_10();
LAB_0010d7b6:
        pFStack_8d8 = (FILE *)0x10d7bb;
        pkcs7_unwrap_cold_11();
LAB_0010d7bb:
        pFStack_8d8 = (FILE *)0x10d7c0;
        pkcs7_unwrap_cold_15();
LAB_0010d7c0:
        pFVar13 = pFVar14;
        pFStack_8d8 = (FILE *)0x10d7c5;
        pkcs7_unwrap_cold_14();
LAB_0010d7c5:
        pFStack_8d8 = (FILE *)0x10d7ca;
        pkcs7_unwrap_cold_13();
      }
      else {
        if (v_flag != 0) {
          ppcVar23 = &pname;
          pFStack_8d8 = (FILE *)0x10d14c;
          printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar3);
          buffer_00 = (EVP_PKEY **)ppcVar23;
        }
        pFStack_8d8 = (FILE *)0x10d159;
        BIO_set_flags((BIO *)pFVar12,0x200);
        pFVar26 = (FILE *)0x0;
        pFStack_8d8 = (FILE *)0x10d163;
        pPVar10 = d2i_PKCS7_bio((BIO *)pFVar12,(PKCS7 **)0x0);
        pFVar19->__pad5 = (size_t)pPVar10;
        if (d_flag != 0) {
          pFStack_8d8 = (FILE *)0x10d18e;
          printf("%s: printing PEM fomatted PKCS#7\n",pname);
          pFVar26 = (FILE *)pFVar19->__pad5;
          pFStack_8d8 = (FILE *)0x10d1a4;
          PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar26);
        }
        pcVar28 = *(char **)(pFVar19->__pad5 + 0x18);
        pFStack_8d8 = (FILE *)0x10d1b4;
        iVar2 = OBJ_obj2nid((ASN1_OBJECT *)pcVar28);
        if (iVar2 != 0x16) goto LAB_0010d77a;
        pcVar28 = (char *)pFVar19->__pad5;
        pFVar26 = (FILE *)0x0;
        pFStack_8d8 = (FILE *)0x10d1cb;
        b_00 = (FILE *)PKCS7_dataInit((PKCS7 *)pcVar28,(BIO *)0x0);
        if (b_00 == (FILE *)0x0) goto LAB_0010d77f;
        pFStack_8d8 = (FILE *)0x10d1dc;
        pBVar8 = BIO_s_mem();
        pFStack_8d8 = (FILE *)0x10d1e4;
        pFVar12 = (FILE *)BIO_new(pBVar8);
        pFStack_8d8 = (FILE *)0x10d1f9;
        uVar3 = BIO_read((BIO *)b_00,auStack_8c8 + 8,0x400);
        pFVar26 = (FILE *)(ulong)uVar3;
        pFVar14 = pFVar26;
        if (0 < (int)uVar3) {
          pFVar13 = (FILE *)(auStack_8c8 + 8);
          do {
            pFStack_8d8 = (FILE *)0x10d213;
            BIO_write((BIO *)pFVar12,pFVar13,(int)pFVar26);
            pFStack_8d8 = (FILE *)0x10d223;
            uVar3 = BIO_read((BIO *)b_00,pFVar13,0x400);
            pFVar26 = (FILE *)(ulong)uVar3;
            pFVar14 = (FILE *)(ulong)((int)pFVar14 + uVar3);
          } while (0 < (int)uVar3);
        }
        pFVar26 = (FILE *)0xb;
        buffer_00 = (EVP_PKEY **)0x0;
        pFStack_8d8 = (FILE *)0x10d23a;
        BIO_ctrl((BIO *)pFVar12,0xb,0,(void *)0x0);
        if (v_flag != 0) {
          pFStack_8d8 = (FILE *)0x10d25b;
          pFVar26 = (FILE *)pname;
          printf("%s: PKCS#7 contains %d bytes of enveloped data\n",pname,pFVar14);
        }
        pcVar28 = (char *)pFVar19->__pad5;
        pFStack_8d8 = (FILE *)0x10d267;
        psVar11 = PKCS7_get_signer_info((PKCS7 *)pcVar28);
        b = (char **)b_00;
        if (psVar11 == (stack_st_PKCS7_SIGNER_INFO *)0x0) goto LAB_0010d784;
        if (v_flag != 0) {
          pFStack_8d8 = (FILE *)0x10d292;
          printf("%s: verifying signature\n",pname);
        }
        pFStack_8d8 = (FILE *)0x10d29c;
        pFVar13 = (FILE *)OPENSSL_sk_value(psVar11,0);
        pFVar26 = (FILE *)pFVar19->__pad5;
        pFStack_8d8 = (FILE *)0x10d2bb;
        buffer_00 = (EVP_PKEY **)cacert;
        pcVar28 = (char *)b_00;
        iVar2 = PKCS7_signatureVerify
                          ((BIO *)b_00,(PKCS7 *)pFVar26,(PKCS7_SIGNER_INFO *)pFVar13,(X509 *)cacert)
        ;
        if (iVar2 < 1) goto LAB_0010d789;
        if (v_flag != 0) {
          pcVar28 = "%s: signature ok\n";
          pFStack_8d8 = (FILE *)0x10d2e2;
          pFVar26 = (FILE *)pname;
          printf("%s: signature ok\n");
        }
        if (d_flag != 0) {
          pcVar28 = "%s: finding signed attributes\n";
          pFStack_8d8 = (FILE *)0x10d306;
          pFVar26 = (FILE *)pname;
          printf("%s: finding signed attributes\n");
        }
        b = (char **)pFVar13->_IO_read_base;
        if ((FILE *)b == (FILE *)0x0) goto LAB_0010d78e;
        pFVar26 = (FILE *)(ulong)(uint)nid_transId;
        buffer_00 = (EVP_PKEY **)auStack_8c8;
        pFStack_8d8 = (FILE *)0x10d32f;
        pcVar28 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_transId,0x13,(char **)buffer_00);
        pcVar4 = (char *)auStack_8c8._0_8_;
        if (iVar2 != 0) goto LAB_0010d793;
        pFStack_8d8 = (FILE *)0x10d357;
        printf("%s: reply transaction id: %s\n",pname,auStack_8c8._0_8_);
        cert = (int *)pFVar19->_IO_buf_end;
        pFStack_8d8 = (FILE *)0x10d363;
        sVar6 = strlen(pcVar4);
        pFStack_8d8 = (FILE *)0x10d371;
        pFVar26 = (FILE *)pcVar4;
        pcVar28 = (char *)cert;
        iVar2 = strncmp((char *)cert,pcVar4,sVar6);
        if (iVar2 != 0) goto LAB_0010d798;
        pFVar26 = (FILE *)(ulong)(uint)nid_messageType;
        buffer_00 = (EVP_PKEY **)auStack_8c8;
        pFStack_8d8 = (FILE *)0x10d394;
        pcVar28 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_messageType,0x13,(char **)buffer_00);
        cert = &v_flag;
        if (iVar2 != 0) goto LAB_0010d79d;
        pFStack_8d8 = (FILE *)0x10d3ad;
        pcVar28 = (char *)auStack_8c8._0_8_;
        iVar2 = atoi((char *)auStack_8c8._0_8_);
        if (iVar2 != 3) goto LAB_0010d7a2;
        if (v_flag != 0) {
          pFStack_8d8 = (FILE *)0x10d3d5;
          printf("%s: reply message type is good\n",pname);
        }
        pFStack_8d8 = (FILE *)0x10d3f0;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_senderNonce,4,(char **)auStack_8c8);
        if ((iVar2 != 0) && (v_flag != 0)) {
          pFStack_8d8 = (FILE *)0x10d766;
          pkcs7_unwrap_cold_6();
        }
        pFVar19->_markers = (_IO_marker *)auStack_8c8._0_8_;
        if (v_flag != 0) {
          pFStack_8d8 = (FILE *)0x10d427;
          printf("%s: senderNonce in reply: ",pname);
          pcVar4 = "%02X";
          lVar30 = 0;
          do {
            pFStack_8d8 = (FILE *)0x10d444;
            printf("%02X",(ulong)*(byte *)((long)&pFVar19->_markers->_next + lVar30));
            lVar30 = lVar30 + 1;
          } while (lVar30 != 0x10);
          pFStack_8d8 = (FILE *)0x10d457;
          putchar(10);
        }
        cert = &v_flag;
        pFVar26 = (FILE *)(ulong)(uint)nid_recipientNonce;
        buffer_00 = (EVP_PKEY **)auStack_8c8;
        pFStack_8d8 = (FILE *)0x10d479;
        pcVar28 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_recipientNonce,4,(char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d7a7;
        pFVar19->_IO_save_end = (char *)auStack_8c8._0_8_;
        if (v_flag != 0) {
          pFStack_8d8 = (FILE *)0x10d4a9;
          printf("%s: recipientNonce in reply: ",pname);
          lVar30 = 0;
          do {
            pFStack_8d8 = (FILE *)0x10d4c6;
            printf("%02X",(ulong)(byte)pFVar19->_IO_save_end[lVar30]);
            lVar30 = lVar30 + 1;
          } while (lVar30 != 0x10);
          pFStack_8d8 = (FILE *)0x10d4d9;
          putchar(10);
        }
        cert = &v_flag;
        pcVar4 = (char *)&pFVar19->_mode;
        lVar30 = 0;
        do {
          if (pFVar19->_IO_save_base[lVar30] != pFVar19->_IO_save_end[lVar30]) {
            if (v_flag != 0) {
              pFStack_8d8 = (FILE *)0x10d770;
              pkcs7_unwrap_cold_8();
            }
            break;
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x10);
        pFVar26 = (FILE *)(ulong)(uint)nid_pkiStatus;
        buffer_00 = (EVP_PKEY **)auStack_8c8;
        pFStack_8d8 = (FILE *)0x10d52c;
        pcVar28 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_pkiStatus,0x13,(char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d7ac;
        pFStack_8d8 = (FILE *)0x10d53e;
        pcVar28 = (char *)auStack_8c8._0_8_;
        uVar3 = atoi((char *)auStack_8c8._0_8_);
        cert = (int *)(ulong)uVar3;
        if (uVar3 == 0) {
          pcVar28 = "%s: pkistatus: SUCCESS\n";
LAB_0010d56e:
          pFStack_8d8 = (FILE *)0x10d57f;
          pFVar26 = (FILE *)pname;
          printf(pcVar28);
          *(uint *)&pFVar19->_IO_write_base = uVar3;
          cert = &v_flag;
          if (uVar3 == 2) {
            pFVar26 = (FILE *)(ulong)(uint)nid_failInfo;
            buffer_00 = (EVP_PKEY **)auStack_8c8;
            pFStack_8d8 = (FILE *)0x10d5ab;
            pcVar28 = (char *)b;
            iVar2 = get_signed_attribute
                              ((stack_st_X509_ATTRIBUTE *)b,nid_failInfo,0x13,(char **)buffer_00);
            if (iVar2 != 0) goto LAB_0010d7b1;
            pFStack_8d8 = (FILE *)0x10d5bd;
            uVar3 = atoi((char *)auStack_8c8._0_8_);
            pcVar28 = (char *)auStack_8c8._0_8_;
            if (uVar3 < 5) {
              buffer_00 = (EVP_PKEY **)(ulong)uVar3;
              iVar2 = *(int *)(&DAT_0011144c + (long)buffer_00 * 4);
              *(uint *)&pFVar19->_IO_write_end = uVar3;
              pcVar28 = "%s: reason: %s\n";
              pFStack_8d8 = (FILE *)0x10d5f1;
              pFVar26 = (FILE *)pname;
              printf("%s: reason: %s\n",pname,&DAT_0011144c + iVar2);
              goto LAB_0010d5f1;
            }
            goto LAB_0010d7b6;
          }
LAB_0010d5f1:
          if (*(int *)&pFVar19->_IO_write_base != 0) {
            if ((v_flag != 0) && ((int)pFVar14 != 0)) {
              pFStack_8d8 = (FILE *)0x10d60f;
              pkcs7_unwrap_cold_12();
            }
            return 0;
          }
          if ((int)pFVar14 == 0) goto LAB_0010d7bb;
          if (pFVar19->_flags - 0x13U < 2) {
            ppXVar15 = (X509 **)&pFVar19->_fileno;
            buffer_00 = (EVP_PKEY **)&pFVar19->_old_offset;
          }
          else {
            ppXVar15 = &localcert;
            buffer_00 = &rsa;
          }
          b = (char **)*buffer_00;
          cert = (int *)*ppXVar15;
          pFVar26 = (FILE *)0x0;
          pFStack_8d8 = (FILE *)0x10d64e;
          pcVar28 = (char *)pFVar12;
          pFVar13 = (FILE *)d2i_PKCS7_bio((BIO *)pFVar12,(PKCS7 **)0x0);
          if (pFVar13 == (FILE *)0x0) goto LAB_0010d7c0;
          if (d_flag != 0) {
            pFStack_8d8 = (FILE *)0x10d67e;
            printf("%s: printing PEM fomatted PKCS#7\n",pname);
            pFStack_8d8 = (FILE *)0x10d690;
            PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar13);
          }
          pFStack_8d8 = (FILE *)0x10d695;
          pBVar8 = BIO_s_mem();
          pFStack_8d8 = (FILE *)0x10d69d;
          pFVar12 = (FILE *)BIO_new(pBVar8);
          if (d_flag != 0) {
            pFStack_8d8 = (FILE *)0x10d6c4;
            printf("%s: decrypting inner PKCS#7\n",pname);
          }
          pFStack_8d8 = (FILE *)0x10d6d8;
          buffer_00 = (EVP_PKEY **)pFVar12;
          pFVar26 = (FILE *)b;
          pcVar28 = (char *)pFVar13;
          iVar2 = PKCS7_decrypt((PKCS7 *)pFVar13,(EVP_PKEY *)b,(X509 *)cert,(BIO *)pFVar12,0);
          if (iVar2 != 0) {
            pFStack_8d8 = (FILE *)0x10d6f1;
            BIO_ctrl((BIO *)pFVar12,0xb,0,(void *)0x0);
            pFStack_8d8 = (FILE *)0x10d703;
            uVar16 = BIO_ctrl((BIO *)pFVar12,3,0,pcVar4);
            *(int *)(pFVar19->_unused2 + 4) = (int)uVar16;
            if (v_flag != 0) {
              pFStack_8d8 = (FILE *)0x10d72f;
              printf("%s: PKCS#7 payload size: %d bytes\n",pname,uVar16 & 0xffffffff);
            }
            pFStack_8d8 = (FILE *)0x10d73c;
            BIO_set_flags((BIO *)pFVar12,0x200);
            pFStack_8d8 = (FILE *)0x10d746;
            pPVar10 = d2i_PKCS7_bio((BIO *)pFVar12,(PKCS7 **)0x0);
            pFVar19->__pad5 = (size_t)pPVar10;
            return 0;
          }
          goto LAB_0010d7c5;
        }
        if (uVar3 == 3) {
          pcVar28 = "%s: pkistatus: PENDING\n";
          goto LAB_0010d56e;
        }
        pFVar13 = pFVar14;
        if (uVar3 == 2) {
          pcVar28 = "%s: pkistatus: FAILURE\n";
          goto LAB_0010d56e;
        }
      }
      pFStack_8d8 = (FILE *)get_signed_attribute;
      pkcs7_unwrap_cold_16();
      pcStack_910 = (code *)0x10d7ea;
      pFStack_8f8 = pFVar19;
      pFStack_8f0 = (FILE *)pcVar4;
      pFStack_8e8 = pFVar12;
      pFStack_8e0 = (FILE *)b;
      pFStack_8d8 = pFVar13;
      iVar2 = get_attribute((stack_st_X509_ATTRIBUTE *)pcVar28,(int)pFVar26,
                            (ASN1_TYPE **)&pFStack_900);
      if (iVar2 != 0) {
        if (v_flag == 0) {
          return 1;
        }
        pcStack_910 = (code *)0x10d8bf;
        get_signed_attribute_cold_1();
        return 1;
      }
      pcStack_910 = (code *)0x10d821;
      ppcVar23 = (char **)pFStack_900;
      uVar3 = ASN1_TYPE_get((ASN1_TYPE *)pFStack_900);
      if (uVar3 == extraout_EDX) {
        pcStack_910 = (code *)0x10d832;
        uVar3 = ASN1_STRING_length((ASN1_STRING *)pFStack_900->_IO_read_ptr);
        if ((int)uVar3 < 1) {
          return 1;
        }
        b = (char **)(ulong)uVar3;
        if (d_flag != 0) {
          pcStack_910 = (code *)0x10d860;
          pFVar26 = (FILE *)pname;
          printf("%s: allocating %d bytes for attribute\n",pname,b);
        }
        ppcVar23 = (char **)(ulong)((extraout_EDX == 0x13) + uVar3);
        pcStack_910 = (code *)0x10d871;
        pcVar28 = (char *)malloc((size_t)ppcVar23);
        *buffer_00 = (EVP_PKEY *)pcVar28;
        if (pcVar28 != (char *)0x0) {
          pcStack_910 = (code *)0x10d885;
          __src = (void *)ASN1_STRING_get0_data((X509_ALGOR *)pFStack_900->_IO_read_ptr);
          pcStack_910 = (code *)0x10d896;
          memcpy(pcVar28,__src,(size_t)b);
          if (extraout_EDX != 0x13) {
            return 0;
          }
          (*buffer_00)[(long)b] = (EVP_PKEY)0x0;
          return 0;
        }
      }
      else {
        pcStack_910 = (code *)0x10d8c9;
        get_signed_attribute_cold_2();
      }
      pcStack_910 = get_attribute;
      get_signed_attribute_cold_3();
      pcVar28 = pname;
      pFStack_920 = pFStack_900;
      pFVar13 = (FILE *)((ulong)pFVar26 & 0xffffffff);
      pFStack_930 = (FILE *)buffer_00;
      pFStack_928 = (FILE *)pcVar4;
      pFStack_918 = (FILE *)b;
      pcStack_910 = (code *)(ulong)extraout_EDX;
      if (d_flag != 0) {
        pFStack_938 = (FILE *)0x10d8fb;
        pcVar17 = OBJ_nid2sn((int)pFVar26);
        pFStack_938 = (FILE *)0x10d90f;
        printf("%s: finding attribute %s\n",pcVar28,pcVar17);
        b = (char **)pcVar28;
      }
      *(long *)extraout_RDX = 0;
      pFStack_938 = (FILE *)0x10d91d;
      pFVar12 = pFVar13;
      pFVar14 = (FILE *)OBJ_nid2obj((int)pFVar26);
      if (pFVar14 != (FILE *)0x0) {
        pFStack_938 = (FILE *)0x10d92d;
        iVar2 = OPENSSL_sk_num(ppcVar23);
        if (0 < iVar2) {
          pFVar13 = (FILE *)0x0;
          do {
            pFStack_938 = (FILE *)0x10d93d;
            pcVar4 = (char *)OPENSSL_sk_value(ppcVar23,pFVar13);
            pFStack_938 = (FILE *)0x10d948;
            a = X509_ATTRIBUTE_get0_object((X509_ATTRIBUTE *)pcVar4);
            pFStack_938 = (FILE *)0x10d953;
            iVar2 = OBJ_cmp(a,(ASN1_OBJECT *)pFVar14);
            if (iVar2 == 0) {
              pFStack_938 = (FILE *)0x10d95f;
              pFVar12 = (FILE *)pcVar4;
              iVar2 = X509_ATTRIBUTE_count((X509_ATTRIBUTE *)pcVar4);
              if (iVar2 != 0) {
                if (*(long *)extraout_RDX != 0) {
                  pFStack_938 = (FILE *)0x10d99b;
                  get_attribute_cold_1();
                  b = (char **)pFVar14;
                  goto LAB_0010d99b;
                }
                pFStack_938 = (FILE *)0x10d973;
                pAVar18 = X509_ATTRIBUTE_get0_type((X509_ATTRIBUTE *)pcVar4,0);
                *(ASN1_TYPE **)extraout_RDX = pAVar18;
              }
            }
            uVar3 = (int)pFVar13 + 1;
            pFVar13 = (FILE *)(ulong)uVar3;
            pFStack_938 = (FILE *)0x10d980;
            iVar2 = OPENSSL_sk_num(ppcVar23);
          } while ((int)uVar3 < iVar2);
        }
        return (int)(*(long *)extraout_RDX == 0);
      }
LAB_0010d99b:
      pFStack_938 = (FILE *)write_crl;
      get_attribute_cold_2();
      pFVar12 = *(FILE **)(*(long *)(pFVar12->__pad5 + 0x20) + 0x18);
      pFStack_950 = (FILE *)0x10d9bb;
      pFStack_940 = (FILE *)ppcVar23;
      pFStack_938 = (FILE *)b;
      pFVar14 = (FILE *)OPENSSL_sk_value(pFVar12,0);
      if (pFVar14 == (FILE *)0x0) {
        pFStack_950 = (FILE *)0x10da68;
        write_crl_cold_3();
LAB_0010da68:
        pFStack_950 = (FILE *)0x10da6d;
        write_crl_cold_2();
        pFVar19 = extraout_RDX;
      }
      else {
        b = &w_char;
        pFStack_950 = (FILE *)0x10d9dd;
        pFVar12 = (FILE *)w_char;
        pFVar19 = fopen(w_char,"w");
        ppcVar23 = (char **)pFVar14;
        if (pFVar19 == (FILE *)0x0) goto LAB_0010da68;
        if (v_flag != 0) {
          pFStack_950 = (FILE *)0x10da0d;
          printf("%s: writing CRL\n",pname);
        }
        if (d_flag != 0) {
          pFStack_950 = (FILE *)0x10da2b;
          PEM_write_X509_CRL(_stdout,(X509_CRL *)pFVar14);
        }
        pFStack_950 = (FILE *)0x10da36;
        pFVar12 = pFVar19;
        iVar2 = PEM_write_X509_CRL(pFVar19,(X509_CRL *)pFVar14);
        if (iVar2 == 1) {
          pFStack_950 = (FILE *)0x10da56;
          printf("%s: CRL written as %s\n",pname,w_char);
          iVar2 = fclose(pFVar19);
          return iVar2;
        }
      }
      pFStack_950 = (FILE *)write_local_cert;
      write_crl_cold_1();
      localcert = (X509 *)0x0;
      pFVar12 = *(FILE **)(*(long *)(pFVar12->__pad5 + 0x20) + 0x10);
      piVar29 = &v_flag;
      pFStack_978 = pFVar19;
      pFStack_970 = (FILE *)pcVar4;
      pFStack_968 = (FILE *)cert;
      pFStack_960 = (FILE *)ppcVar23;
      pFStack_958 = (FILE *)b;
      pFStack_950 = pFVar13;
      if (v_flag != 0) {
        pFStack_1988 = (FILE *)0x10dab3;
        uVar3 = OPENSSL_sk_num(pFVar12);
        pFStack_1988 = (FILE *)0x10dac3;
        printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar3);
      }
      pFStack_1988 = (FILE *)0x10dacb;
      pFVar14 = pFVar12;
      iVar2 = OPENSSL_sk_num();
      pFVar19 = (FILE *)localcert;
      if (0 < iVar2) {
        ppcVar23 = (char **)0x0;
        do {
          pFStack_1988 = (FILE *)0x10dae1;
          cert = (int *)OPENSSL_sk_value(pFVar12,ppcVar23);
          pcVar28 = pname;
          if (v_flag != 0) {
            pFStack_1988 = (FILE *)0x10db01;
            pXVar20 = X509_get_subject_name((X509 *)cert);
            pFStack_1988 = (FILE *)0x10db14;
            pcVar4 = X509_NAME_oneline(pXVar20,(char *)aFStack_1980,0x400);
            pFStack_1988 = (FILE *)0x10db28;
            printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar28,pcVar4);
            pFStack_1988 = (FILE *)0x10db30;
            pXVar20 = X509_get_issuer_name((X509 *)cert);
            pFStack_1988 = (FILE *)0x10db40;
            pcVar28 = X509_NAME_oneline(pXVar20,(char *)aFStack_1980,0x400);
            pFStack_1988 = (FILE *)0x10db51;
            printf("  issuer: %s\n",pcVar28);
            pFStack_1988 = (FILE *)0x10db5d;
            pXVar20 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFStack_1988 = (FILE *)0x10db6d;
            pcVar28 = X509_NAME_oneline(pXVar20,(char *)aFStack_1980,0x400);
            pFStack_1988 = (FILE *)0x10db7e;
            printf("  request_subject: \'%s\'\n",pcVar28);
            pFVar13 = aFStack_1980;
          }
          pFStack_1988 = (FILE *)0x10db86;
          pXVar20 = X509_get_subject_name((X509 *)cert);
          pFStack_1988 = (FILE *)0x10db95;
          b_01 = (X509_NAME *)X509_REQ_get_subject_name(request);
          pFStack_1988 = (FILE *)0x10dba0;
          iVar2 = X509_NAME_cmp(pXVar20,b_01);
          if (d_flag != 0) {
            pFStack_1988 = (FILE *)0x10dc81;
            write_local_cert_cold_1();
          }
          if (iVar2 == 0) {
LAB_0010dc26:
            if (v_flag != 0) {
              pFStack_1988 = (FILE *)0x10dc39;
              puts("CN\'s of request and certificate matched!");
            }
          }
          else {
            pFStack_1988 = (FILE *)0x10dbc0;
            pXVar20 = X509_get_subject_name((X509 *)cert);
            pFStack_1988 = (FILE *)0x10dbd8;
            X509_NAME_oneline(pXVar20,acStack_1180,0x400);
            pFStack_1988 = (FILE *)0x10dbe4;
            pXVar20 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFVar13 = aFStack_1580;
            pFStack_1988 = (FILE *)0x10dbfc;
            X509_NAME_oneline(pXVar20,(char *)pFVar13,0x400);
            if (v_flag != 0) {
              pFStack_1988 = (FILE *)0x10dc17;
              printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n"
                     ,pFVar13,acStack_1180);
            }
            pFStack_1988 = (FILE *)0x10dc22;
            iVar2 = strcmp(acStack_1180,(char *)pFVar13);
            if (iVar2 == 0) goto LAB_0010dc26;
            pFStack_1988 = (FILE *)0x10dc8b;
            write_local_cert_cold_2();
          }
          pFStack_1988 = (FILE *)0x10dc41;
          b = (char **)X509_get_subject_name((X509 *)cert);
          pFStack_1988 = (FILE *)0x10dc4c;
          pXVar20 = X509_get_issuer_name((X509 *)cert);
          pFStack_1988 = (FILE *)0x10dc57;
          pFVar14 = (FILE *)b;
          iVar2 = X509_NAME_cmp((X509_NAME *)b,pXVar20);
          pFVar19 = (FILE *)cert;
          if (iVar2 != 0) break;
          uVar3 = (int)ppcVar23 + 1;
          ppcVar23 = (char **)(ulong)uVar3;
          pFStack_1988 = (FILE *)0x10dc66;
          pFVar14 = pFVar12;
          iVar2 = OPENSSL_sk_num();
          pFVar19 = (FILE *)localcert;
        } while ((int)uVar3 < iVar2);
      }
      localcert = (X509 *)pFVar19;
      if (localcert == (X509 *)0x0) {
        pFStack_1988 = (FILE *)0x10dd37;
        write_local_cert_cold_5();
LAB_0010dd37:
        pFStack_1988 = (FILE *)0x10dd3c;
        write_local_cert_cold_4();
      }
      else {
        ppcVar23 = &l_char;
        pFStack_1988 = (FILE *)0x10dcb8;
        pFVar14 = (FILE *)l_char;
        pFVar19 = fopen(l_char,"w");
        if (pFVar19 == (FILE *)0x0) goto LAB_0010dd37;
        if (v_flag != 0) {
          pFStack_1988 = (FILE *)0x10dce2;
          printf("%s: certificate written as %s\n",pname,l_char);
        }
        if (d_flag != 0) {
          pFStack_1988 = (FILE *)0x10dd04;
          PEM_write_X509(_stdout,(X509 *)localcert);
        }
        pFStack_1988 = (FILE *)0x10dd13;
        pFVar14 = pFVar19;
        iVar2 = PEM_write_X509(pFVar19,(X509 *)localcert);
        pFVar12 = pFVar19;
        if (iVar2 == 1) {
          pFStack_1988 = (FILE *)0x10dd20;
          iVar2 = fclose(pFVar19);
          return iVar2;
        }
      }
      pFStack_1988 = (FILE *)write_other_cert;
      write_local_cert_cold_3();
      piStack_19a8 = &v_flag;
      ppcVar31 = *(char ***)(*(long *)(pFVar14->__pad5 + 0x20) + 0x10);
      pFStack_1dd0 = (FILE *)0x10dd6e;
      pFVar19 = (FILE *)ppcVar31;
      pFStack_1dc0 = pFVar14;
      pFStack_19b0 = pFVar12;
      pFStack_19a0 = (FILE *)cert;
      pFStack_1998 = (FILE *)ppcVar23;
      pFStack_1990 = (FILE *)b;
      pFStack_1988 = pFVar13;
      iVar2 = OPENSSL_sk_num();
      pFVar12 = (FILE *)0x0;
      if (0 < iVar2) {
        cert = (int *)0x0;
        do {
          pFStack_1dd0 = (FILE *)0x10dd86;
          pFVar13 = (FILE *)OPENSSL_sk_value(ppcVar31,cert);
          pcVar28 = pname;
          if (v_flag != 0) {
            pFStack_1dd0 = (FILE *)0x10dda7;
            pXVar20 = X509_get_subject_name((X509 *)pFVar13);
            ppcVar23 = (char **)aFStack_1db8;
            pFStack_1dd0 = (FILE *)0x10ddbc;
            pcVar4 = X509_NAME_oneline(pXVar20,(char *)ppcVar23,0x400);
            pFStack_1dd0 = (FILE *)0x10ddd0;
            printf("%s: found certificate with\n  subject: %s\n",pcVar28,pcVar4);
            pFStack_1dd0 = (FILE *)0x10ddd8;
            pXVar20 = X509_get_issuer_name((X509 *)pFVar13);
            pFStack_1dd0 = (FILE *)0x10dde8;
            pcVar4 = X509_NAME_oneline(pXVar20,(char *)ppcVar23,0x400);
            pFStack_1dd0 = (FILE *)0x10ddf9;
            printf("  issuer: %s\n",pcVar4);
            piVar29 = (int *)pcVar28;
          }
          pFStack_1dd0 = (FILE *)0x10de01;
          pFVar19 = (FILE *)X509_get_serialNumber((X509 *)pFVar13);
          pFStack_1dd0 = (FILE *)0x10de19;
          iVar2 = ASN1_INTEGER_cmp((ASN1_INTEGER *)pFVar19,
                                   *(ASN1_INTEGER **)((long)pFStack_1dc0->__pad3 + 8));
          pFVar12 = pFVar13;
          if (iVar2 == 0) break;
          uVar3 = (int)cert + 1;
          cert = (int *)(ulong)uVar3;
          pFStack_1dd0 = (FILE *)0x10de2c;
          pFVar19 = (FILE *)ppcVar31;
          iVar2 = OPENSSL_sk_num();
          pFVar12 = (FILE *)0x0;
        } while ((int)uVar3 < iVar2);
      }
      if (pFVar12 == (FILE *)0x0) {
        pFStack_1dd0 = (FILE *)0x10ded0;
        write_other_cert_cold_3();
      }
      else {
        ppcVar31 = &w_char;
        pFStack_1dd0 = (FILE *)0x10de54;
        pFVar19 = (FILE *)w_char;
        pFVar14 = fopen(w_char,"w");
        if (pFVar14 != (FILE *)0x0) {
          if (v_flag != 0) {
            pFStack_1dd0 = (FILE *)0x10de83;
            printf("%s: certificate written as %s\n",pname,w_char);
          }
          if (d_flag != 0) {
            pFStack_1dd0 = (FILE *)0x10dea1;
            PEM_write_X509(_stdout,(X509 *)pFVar12);
          }
          pFStack_1dd0 = (FILE *)0x10deac;
          pFVar19 = pFVar14;
          iVar2 = PEM_write_X509(pFVar14,(X509 *)pFVar12);
          ppcVar23 = (char **)pFVar14;
          if (iVar2 == 1) {
            pFStack_1dd0 = (FILE *)0x10deb9;
            iVar2 = fclose(pFVar14);
            return iVar2;
          }
          goto LAB_0010ded5;
        }
      }
      pFStack_1dd0 = (FILE *)0x10ded5;
      write_other_cert_cold_2();
LAB_0010ded5:
      pFStack_1dd0 = (FILE *)write_ca_ra;
      write_other_cert_cold_1();
      pFStack_1df8 = pFVar12;
      piStack_1df0 = piVar29;
      pFStack_1de8 = (FILE *)cert;
      pFStack_1de0 = (FILE *)ppcVar23;
      pFStack_1dd8 = (FILE *)ppcVar31;
      pFStack_1dd0 = pFVar13;
      pBVar9 = BIO_new_mem_buf(pFVar19->_IO_read_end,*(int *)&pFVar19->_IO_read_base);
      pPVar10 = d2i_PKCS7_bio(pBVar9,(PKCS7 **)0x0);
      if (pPVar10 == (PKCS7 *)0x0) {
        pcVar28 = "%s: error reading PKCS#7 data\n";
LAB_0010df27:
        fprintf(_stderr,pcVar28,pname);
LAB_0010df31:
        ERR_print_errors_fp(_stderr);
      }
      else {
        iVar2 = OBJ_obj2nid(pPVar10->type);
        if (iVar2 == 0x16) {
          lVar30 = ((pPVar10->d).data)->flags;
          if (lVar30 != 0) {
            pPStack_2658 = pPVar10;
            pBStack_2650 = pBVar9;
            iVar2 = OPENSSL_sk_num(lVar30);
            if (0 < iVar2) {
              uVar16 = 0;
              lStack_2648 = lVar30;
              do {
                memset(acStack_2600,0,0x400);
                memset(acStack_2200,0,0x400);
                a_00 = (X509 *)OPENSSL_sk_value(lVar30,uVar16);
                snprintf(acStack_2200,0x400,"%s-%d",c_char,uVar16);
                pcVar28 = pname;
                if (v_flag != 0) {
                  pXVar20 = X509_get_subject_name(a_00);
                  pcVar4 = X509_NAME_oneline(pXVar20,acStack_2600,0x400);
                  printf("\n%s: found certificate with\n  subject: %s\n",pcVar28,pcVar4);
                }
                if (v_flag != 0) {
                  pXVar20 = X509_get_issuer_name(a_00);
                  pcVar28 = X509_NAME_oneline(pXVar20,acStack_2600,0x400);
                  printf("  issuer: %s\n",pcVar28);
                }
                iVar2 = X509_digest(a_00,(EVP_MD *)fp_alg,abStack_2640,&uStack_265c);
                if (iVar2 == 0) goto LAB_0010df31;
                iVar2 = X509_get_ext_by_NID(a_00,0x57,-1);
                if (iVar2 < 0) {
                  if (v_flag != 0) {
                    puts("  basic constraints: (not included)");
                  }
                }
                else {
                  pXVar21 = X509_get_ext(a_00,iVar2);
                  if (v_flag != 0) {
                    printf("  basic constraints: ");
                    X509V3_EXT_print_fp(_stdout,pXVar21,0,0);
                    putchar(10);
                  }
                }
                iVar2 = X509_get_ext_by_NID(a_00,0x53,-1);
                if (iVar2 < 0) {
                  if (v_flag != 0) {
                    puts("  usage: (not included)");
                  }
                }
                else {
                  pXVar21 = X509_get_ext(a_00,iVar2);
                  if (v_flag != 0) {
                    printf("  usage: ");
                    X509V3_EXT_print_fp(_stdout,pXVar21,0,0);
                    putchar(10);
                  }
                }
                if (v_flag != 0) {
                  iVar2 = EVP_MD_get_type(fp_alg);
                  pcVar28 = OBJ_nid2sn(iVar2);
                  printf("  %s fingerprint: ",pcVar28);
                  uVar24 = (ulong)uStack_265c;
                  if (0 < (int)uStack_265c) {
                    uVar22 = 0;
                    do {
                      uVar1 = uVar22 + 1;
                      uVar25 = 10;
                      if (uVar1 != (uVar24 & 0xffffffff)) {
                        uVar25 = 0x3a;
                      }
                      printf("%02X%c",(ulong)abStack_2640[uVar22],uVar25);
                      uVar24 = (ulong)(int)uStack_265c;
                      uVar22 = uVar1;
                    } while ((long)uVar1 < (long)uVar24);
                  }
                }
                pFVar13 = fopen(acStack_2200,"w");
                if (pFVar13 == (FILE *)0x0) {
                  pcVar28 = "%s: cannot open cert file for writing\n";
                  goto LAB_0010df71;
                }
                if (v_flag != 0) {
                  printf("%s: certificate written as %s\n",pname,acStack_2200);
                }
                if (d_flag != 0) {
                  PEM_write_X509(_stdout,a_00);
                }
                iVar2 = PEM_write_X509(pFVar13,a_00);
                if (iVar2 != 1) {
                  pcVar28 = "%s: error while writing certificate file\n";
                  goto LAB_0010df27;
                }
                fclose(pFVar13);
                lVar30 = lStack_2648;
                uVar3 = (int)uVar16 + 1;
                uVar16 = (ulong)uVar3;
                iVar2 = OPENSSL_sk_num(lStack_2648);
              } while ((int)uVar3 < iVar2);
            }
            PKCS7_free(pPStack_2658);
            BIO_free(pBStack_2650);
            exit(0);
          }
          pcVar28 = "%s: cannot find certificates\n";
LAB_0010df71:
          fprintf(_stderr,pcVar28,pname);
        }
        else {
          printf("%s: wrong PKCS#7 type\n",pname);
        }
      }
      exit(0x5d);
    }
  }
  pFStack_490 = (FILE *)0x10d084;
  pkcs7_verify_unwrap_cold_9();
LAB_0010d084:
  pFStack_490 = (FILE *)0x10d09c;
  printf("%s: error verifying signature Error \n",pname);
  pFStack_490 = (FILE *)0x10d0ab;
  ERR_print_errors_fp(_stderr);
  pFStack_490 = (FILE *)0x10d0b5;
  exit(0x61);
}

Assistant:

int add_attribute_string(STACK_OF(X509_ATTRIBUTE) *attrs, int nid, char *buffer){
	ASN1_STRING     *asn1_string = NULL;
	X509_ATTRIBUTE  *x509_a;
	int		c;

	if (d_flag)
		printf("%s: adding string attribute %s\n", pname,
			OBJ_nid2sn(nid));

	asn1_string = ASN1_STRING_new();
	if ((c = ASN1_STRING_set(asn1_string, buffer, strlen(buffer))) <= 0) {
		fprintf(stderr, "%s: error adding data to ASN.1 string\n",
			pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	x509_a = X509_ATTRIBUTE_create(nid, V_ASN1_PRINTABLESTRING,
		asn1_string);
	sk_X509_ATTRIBUTE_push(attrs, x509_a);
	return (0);

}